

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

void ProcessThread::addPid(pid_t pid,Process *process,bool async)

{
  bool bVar1;
  pointer ppVar2;
  element_type *this;
  mapped_type *this_00;
  shared_ptr<EventLoop> local_b0;
  ProcessData local_a0;
  undefined4 local_84;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_80;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_78;
  anon_class_16_2_6691087b_for_obj local_70;
  shared_ptr<EventLoop> local_60;
  int local_4c;
  _Node_iterator_base<std::pair<const_int,_int>,_false> _Stack_48;
  int ret;
  _Node_iterator_base<std::pair<const_int,_int>,_false> local_30;
  iterator it;
  lock_guard<std::mutex> lock;
  bool async_local;
  Process *process_local;
  pid_t pid_local;
  
  process_local._4_4_ = pid;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&it,&sProcessMutex);
  sPending = sPending + -1;
  bVar1 = std::
          unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::empty(&sPendingPids);
  if (!bVar1) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
         ::find(&sPendingPids,(key_type *)((long)&process_local + 4));
    _Stack_48._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
         ::end(&sPendingPids);
    bVar1 = std::__detail::operator!=(&local_30,&stack0xffffffffffffffb8);
    if (bVar1) {
      ppVar2 = std::__detail::_Node_iterator<std::pair<const_int,_int>,_false,_false>::operator->
                         ((_Node_iterator<std::pair<const_int,_int>,_false,_false> *)&local_30);
      local_4c = ppVar2->second;
      if (async) {
        EventLoop::eventLoop();
        this = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_60);
        local_70.ret = local_4c;
        local_70.process = process;
        EventLoop::callLater<ProcessThread::addPid(int,Process*,bool)::__0>(this,&local_70);
        std::shared_ptr<EventLoop>::~shared_ptr(&local_60);
      }
      else {
        Process::finish(process,local_4c);
      }
      local_78._M_cur = local_30._M_cur;
      local_80._M_cur =
           (__node_type *)
           std::
           unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
           ::erase(&sPendingPids,local_30._M_cur);
      if (sPending == 0) {
        std::
        unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::clear(&sPendingPids);
      }
      local_84 = 1;
      goto LAB_002a6f56;
    }
  }
  local_a0.proc = process;
  if (async) {
    EventLoop::eventLoop();
  }
  else {
    std::shared_ptr<EventLoop>::shared_ptr(&local_b0);
  }
  std::weak_ptr<EventLoop>::weak_ptr<EventLoop,void>(&local_a0.loop,&local_b0);
  this_00 = std::
            map<int,_ProcessThread::ProcessData,_std::less<int>,_std::allocator<std::pair<const_int,_ProcessThread::ProcessData>_>_>
            ::operator[](&sProcesses,(key_type_conflict *)((long)&process_local + 4));
  ProcessData::operator=(this_00,&local_a0);
  ProcessData::~ProcessData(&local_a0);
  std::shared_ptr<EventLoop>::~shared_ptr(&local_b0);
  if (sPending == 0) {
    std::
    unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::clear(&sPendingPids);
  }
  local_84 = 0;
LAB_002a6f56:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it);
  return;
}

Assistant:

void ProcessThread::addPid(pid_t pid, Process* process, bool async)
{
    std::lock_guard<std::mutex> lock(sProcessMutex);
    sPending -= 1;

    if (!sPendingPids.empty()) {
        // we have to check
        auto it = sPendingPids.find(pid);
        if (it != sPendingPids.end()) {
            // fire the signal now
            const int ret = it->second;
            if (async) {
                EventLoop::eventLoop()->callLater([process, ret]() { process->finish(ret); });
            } else {
                process->finish(ret);
            }
            sPendingPids.erase(it);
            if (!sPending)
                sPendingPids.clear();
            return;
        }
    }

    sProcesses[pid] = { process, async ? EventLoop::eventLoop() : EventLoop::SharedPtr() };

    if (!sPending)
        sPendingPids.clear();
}